

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIP_SolverBranchAndBound.h
# Opt level: O1

void __thiscall
BGIP_SolverBranchAndBound<JointPolicyPureVector>::PrintStatistics
          (BGIP_SolverBranchAndBound<JointPolicyPureVector> *this,Index i)

{
  int iVar1;
  ostream *poVar2;
  int iVar3;
  uint uVar4;
  double dVar5;
  undefined1 auVar6 [16];
  stringstream stats;
  long *local_1c0;
  long local_1b8;
  long local_1b0 [2];
  stringstream local_1a0 [16];
  undefined1 local_190 [112];
  ios_base local_120 [264];
  
  iVar1 = this->_m_verbosity;
  uVar4 = 100000;
  if (1 < iVar1) {
    iVar3 = 6;
    if (iVar1 < 6) {
      iVar3 = iVar1;
    }
    dVar5 = pow(10.0,(double)(iVar3 + -1));
    auVar6._0_8_ = 100000.0 / dVar5;
    auVar6._8_8_ = 0;
    uVar4 = vcvttsd2usi_avx512f(auVar6);
  }
  if (((-1 < this->_m_verbosity) && (uVar4 < i)) && (i % uVar4 == 0)) {
    std::__cxx11::stringstream::stringstream(local_1a0);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)local_190);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,"-th node selected for expansion:   ",0x23);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," nodes in queue ( ",0x12);
    dVar5 = GetPerJPRatio(this,(long)(this->_m_openQueue->c).
                                     super__Vector_base<boost::shared_ptr<BGIP_BnB_Node>,_std::allocator<boost::shared_ptr<BGIP_BnB_Node>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->_m_openQueue->c).
                                     super__Vector_base<boost::shared_ptr<BGIP_BnB_Node>,_std::allocator<boost::shared_ptr<BGIP_BnB_Node>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 4);
    poVar2 = std::ostream::_M_insert<double>(dVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," per joint policy), pruned ",0x1b);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,", full policies ",0x10);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"( ",2);
    dVar5 = GetPerJPRatio(this,this->_m_nrNodesFullySpecified);
    poVar2 = std::ostream::_M_insert<double>(dVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," pjp )",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"BGIP_SolverBranchAndBound ",0x1a);
    std::__cxx11::stringbuf::str();
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_1c0,local_1b8);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    if (local_1c0 != local_1b0) {
      operator_delete(local_1c0,local_1b0[0] + 1);
    }
    std::__cxx11::stringstream::~stringstream(local_1a0);
    std::ios_base::~ios_base(local_120);
  }
  return;
}

Assistant:

void PrintStatistics(Index i) const
    {
#define PRINTNUM 100000
        Index printNum = PRINTNUM;
        if(_m_verbosity>1)
        {
            // limit the second argument of pow(), otherwise we get SIGFPE
            printNum /= pow(10,std::min(_m_verbosity-1,5));
        }
        if(_m_verbosity>=0 && i % printNum == 0 && i > printNum) 
        {
            //do not do the printing when not outputting it!
            std::stringstream stats;
            stats << i << "-th node selected for expansion:   "<<_m_openQueue->size() 
                  << " nodes in queue ( "
                  << GetPerJPRatio(_m_openQueue->size())
                  <<" per joint policy), pruned "
                  << _m_nrNodesPruned
                  << ", full policies "
                  << _m_nrNodesFullySpecified
                  << "( " << GetPerJPRatio(_m_nrNodesFullySpecified)
                  << " pjp )";
            std::cout << "BGIP_SolverBranchAndBound " << stats.str() << std::endl;
        }
    }